

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O0

int compare_keys(void *key1,void *key2)

{
  undefined4 local_40;
  int res;
  size_t min_size;
  key_len *k2;
  key_len *k1;
  void *key2_local;
  void *key1_local;
  
  if (*(int *)((long)key1 + 8) < *(int *)((long)key2 + 8)) {
    local_40 = *(int *)((long)key1 + 8);
  }
  else {
    local_40 = *(int *)((long)key2 + 8);
  }
  key1_local._4_4_ = memcmp(*key1,*key2,(long)local_40);
  if (key1_local._4_4_ == 0) {
    key1_local._4_4_ = *(int *)((long)key1 + 8) - *(int *)((long)key2 + 8);
  }
  return key1_local._4_4_;
}

Assistant:

static int compare_keys(const void *key1, const void *key2) {
    const struct key_len *k1 = key1;
    const struct key_len *k2 = key2;
    const size_t min_size = k1->len < k2->len ? k1->len : k2->len;
    int res = memcmp(k1->key, k2->key, min_size);

    if (res)
        return res;

    return k1->len - k2->len;
}